

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_se(bitstream *str,int32_t *val)

{
  int iVar1;
  bitstream *in_RSI;
  int *in_RDI;
  uint32_t tmp;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  int local_4;
  
  if (*in_RDI == 0) {
    if (in_RSI->dir == 0x80000000) {
      fprintf(_stderr,"Exp-Golomb signed number equal to -2^31\n");
      local_4 = 1;
    }
    else {
      if ((int)in_RSI->dir < 1) {
        iVar1 = in_RSI->dir * -2;
      }
      else {
        iVar1 = in_RSI->dir * 2 + -1;
      }
      local_4 = vs_ue(in_RSI,(uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    }
  }
  else {
    iVar1 = vs_ue(in_RSI,(uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (iVar1 == 0) {
      if ((in_stack_ffffffffffffffe4 & 1) == 0) {
        in_RSI->dir = -(in_stack_ffffffffffffffe4 >> 1);
      }
      else {
        in_RSI->dir = in_stack_ffffffffffffffe4 + 1 >> 1;
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int vs_se(struct bitstream *str, int32_t *val) {
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		if (*val == (int32_t)(-0x7fffffff-1)) {
			fprintf (stderr, "Exp-Golomb signed number equal to -2^31\n");
			return 1;
		}
		if (*val > 0) {
			tmp = *val * 2 - 1;
		} else {
			tmp = -*val * 2;
		}
		return vs_ue(str, &tmp);
	} else {
		if (vs_ue(str, &tmp))
			return 1;
		if (tmp & 1) {
			*val = (tmp + 1) >> 1;
		} else {
			*val = -(tmp >> 1);
		}
		return 0;
	}
}